

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

void wabt::WriteFixedS32Leb128(Stream *stream,uint32_t value,char *desc)

{
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  char *pcStack_20;
  uint8_t data [5];
  char *desc_local;
  uint32_t value_local;
  Stream *stream_local;
  
  local_25 = (byte)value & 0x7f | 0x80;
  local_24 = (byte)(value >> 7) & 0x7f | 0x80;
  local_23 = (byte)(value >> 0xe) & 0x7f | 0x80;
  local_22 = (byte)(value >> 0x15) & 0x7f | 0x80;
  local_21 = (byte)(value >> 0x1c);
  if ((int)value < 0) {
    local_21 = local_21 | 0x70;
  }
  pcStack_20 = desc;
  Stream::WriteData(stream,&local_25,5,desc,No);
  return;
}

Assistant:

void WriteFixedS32Leb128(Stream* stream, uint32_t value, const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  data[0] = (value & 0x7f) | 0x80;
  data[1] = ((value >> 7) & 0x7f) | 0x80;
  data[2] = ((value >> 14) & 0x7f) | 0x80;
  data[3] = ((value >> 21) & 0x7f) | 0x80;
  // The last byte needs to be sign-extended.
  data[4] = ((value >> 28) & 0x0f);
  if (static_cast<int32_t>(value) < 0) {
    data[4] |= 0x70;
  }
  stream->WriteData(data, MAX_U32_LEB128_BYTES, desc);
}